

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O0

void __thiscall Imf_2_5::IStream::~IStream(IStream *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__IStream_00441028;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

IStream::~IStream ()
{
    // empty
}